

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O3

bool __thiscall
icu_63::number::impl::ConstantMultiFieldModifier::semanticallyEquivalent
          (ConstantMultiFieldModifier *this,Modifier *other)

{
  ModifierStore *pMVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = false;
  lVar2 = __dynamic_cast(other,&Modifier::typeinfo,&typeinfo,0);
  if (lVar2 != 0) {
    pMVar1 = (this->fParameters).obj;
    if (pMVar1 == (ModifierStore *)0x0) {
      bVar3 = NumberStringBuilder::contentEquals(&this->fPrefix,(NumberStringBuilder *)(lVar2 + 8));
      if (((bVar3) &&
          (bVar3 = NumberStringBuilder::contentEquals
                             (&this->fSuffix,(NumberStringBuilder *)(lVar2 + 0x108)), bVar3)) &&
         (this->fOverwrite == (bool)*(char *)(lVar2 + 0x208))) {
        bVar3 = this->fStrong == (bool)*(char *)(lVar2 + 0x209);
      }
      else {
        bVar3 = false;
      }
    }
    else {
      bVar3 = pMVar1 == *(ModifierStore **)(lVar2 + 0x210);
    }
  }
  return bVar3;
}

Assistant:

bool ConstantMultiFieldModifier::semanticallyEquivalent(const Modifier& other) const {
    auto* _other = dynamic_cast<const ConstantMultiFieldModifier*>(&other);
    if (_other == nullptr) {
        return false;
    }
    if (fParameters.obj != nullptr) {
        return fParameters.obj == _other->fParameters.obj;
    }
    return fPrefix.contentEquals(_other->fPrefix)
        && fSuffix.contentEquals(_other->fSuffix)
        && fOverwrite == _other->fOverwrite
        && fStrong == _other->fStrong;
}